

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O3

uint aom_highbd_sad32x8_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint16_t *sec_ptr;
  uint16_t *src_ptr;
  bool bVar3;
  uint16_t *ref_ptr;
  undefined1 auVar4 [32];
  __m256i sad;
  __m256i local_80 [2];
  
  local_80[0] = (__m256i)ZEXT1632(ZEXT816(0) << 0x40);
  src_ptr = (uint16_t *)((long)src * 2);
  ref_ptr = (uint16_t *)((long)ref * 2);
  sec_ptr = (uint16_t *)((long)second_pred * 2);
  bVar2 = true;
  do {
    bVar3 = bVar2;
    sad32x4(src_ptr,src_stride,ref_ptr,ref_stride,sec_ptr,local_80);
    sec_ptr = sec_ptr + 0x80;
    src_ptr = src_ptr + src_stride * 4;
    ref_ptr = ref_ptr + ref_stride * 4;
    bVar2 = false;
  } while (bVar3);
  auVar4 = vpsrldq_avx2((undefined1  [32])local_80[0],8);
  auVar4 = vpaddd_avx2(auVar4,(undefined1  [32])local_80[0]);
  auVar1 = vpaddd_avx(auVar4._16_16_,auVar4._0_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  return auVar1._0_4_;
}

Assistant:

unsigned int aom_highbd_sad32x8_avg_avx2(const uint8_t *src, int src_stride,
                                         const uint8_t *ref, int ref_stride,
                                         const uint8_t *second_pred) {
  __m256i sad = _mm256_setzero_si256();
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  uint16_t *refp = CONVERT_TO_SHORTPTR(ref);
  uint16_t *secp = CONVERT_TO_SHORTPTR(second_pred);
  const int left_shift = 2;
  int row_section = 0;

  while (row_section < 2) {
    sad32x4(srcp, src_stride, refp, ref_stride, secp, &sad);
    srcp += src_stride << left_shift;
    refp += ref_stride << left_shift;
    secp += 32 << left_shift;
    row_section += 1;
  }
  return get_sad_from_mm256_epi32(&sad);
}